

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall pfederc::LogMessage::~LogMessage(LogMessage *this)

{
  ~LogMessage(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

LogMessage::~LogMessage() {
}